

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O0

int __thiscall
nsync::nsync_mu_wait_with_deadline
          (nsync *this,nsync_mu *mu,_func_int_void_ptr *condition,void *condition_arg,
          _func_int_void_ptr_void_ptr *condition_arg_eq,nsync_time abs_deadline,
          nsync_note cancel_note)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  nsync_dll_element_ *pnVar7;
  nsync_dll_list_ pnVar8;
  nsync_note cancel_note_00;
  bool bVar9;
  nsync_time abs_deadline_00;
  int local_74;
  uint local_70;
  int have_lock;
  uint attempts;
  int sem_outcome;
  int had_waiters;
  uint32_t add_to_acquire;
  uint32_t remove_count;
  uint32_t has_condition;
  uint32_t old_word;
  int outcome;
  waiter *w;
  int condition_is_true;
  int first_wait;
  lock_type *l_type;
  _func_int_void_ptr_void_ptr *condition_arg_eq_local;
  void *condition_arg_local;
  _func_int_void_ptr *condition_local;
  nsync_mu *mu_local;
  nsync_time abs_deadline_local;
  
  cancel_note_00 = (nsync_note)condition_arg_eq;
  uVar3 = std::atomic_load_explicit<unsigned_int>((atomic<unsigned_int> *)this,memory_order_relaxed)
  ;
  if ((uVar3 & 0xffffff01) == 0) {
    nsync_panic_("nsync_mu not held in some mode when calling nsync_mu_wait_with_deadline()\n");
  }
  _condition_is_true = (lock_type *)nsync_writer_type_;
  if ((uVar3 & 0xffffff00) != 0) {
    _condition_is_true = (lock_type *)nsync_reader_type_;
  }
  bVar2 = true;
  bVar9 = true;
  if (mu != (nsync_mu *)0x0) {
    iVar4 = (*(code *)mu)(condition);
    bVar9 = iVar4 != 0;
  }
  _old_word = (waiter *)0x0;
  has_condition = 0;
  while( true ) {
    bVar1 = false;
    if (has_condition == 0) {
      bVar1 = (bool)(bVar9 ^ 1);
    }
    if (!bVar1) break;
    if (_old_word == (waiter *)0x0) {
      _old_word = nsync_waiter_new_();
    }
    _old_word->cv_mu = (nsync_mu_s_ *)0x0;
    _old_word->l_type = _condition_is_true;
    (_old_word->cond).f = (_func_int_void_ptr *)mu;
    (_old_word->cond).v = condition;
    (_old_word->cond).eq = (_func_int_void_ptr_void_ptr *)condition_arg;
    add_to_acquire = 0;
    if (mu != (nsync_mu *)0x0) {
      add_to_acquire = 0x10;
    }
    std::atomic_store_explicit<unsigned_int>(&(_old_word->nw).waiting,1,memory_order_relaxed);
    uVar3 = std::atomic_load_explicit<unsigned_int>(&_old_word->remove_count,memory_order_relaxed);
    uVar5 = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)this,2,add_to_acquire | 6,0x80);
    if (bVar2) {
      pnVar7 = nsync_dll_last_(*(nsync_dll_list_ *)(this + 8));
      nsync_maybe_merge_conditions_(pnVar7,&(_old_word->nw).q);
      pnVar8 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(this + 8),&(_old_word->nw).q);
      *(nsync_dll_list_ *)(this + 8) = pnVar8;
      bVar2 = false;
    }
    else {
      pnVar7 = nsync_dll_first_(*(nsync_dll_list_ *)(this + 8));
      nsync_maybe_merge_conditions_(&(_old_word->nw).q,pnVar7);
      pnVar8 = nsync_dll_make_first_in_list_(*(nsync_dll_list_ *)(this + 8),&(_old_word->nw).q);
      *(nsync_dll_list_ *)(this + 8) = pnVar8;
    }
    do {
      uVar6 = std::atomic_load_explicit<unsigned_int>
                        ((atomic<unsigned_int> *)this,memory_order_relaxed);
      sem_outcome = _condition_is_true->add_to_acquire;
      if (((uVar6 - _condition_is_true->add_to_acquire & 0xffffff01) == 0) && ((uVar5 & 0xc) == 4))
      {
        sem_outcome = 0;
      }
      iVar4 = atm_cas_rel_u32_((nsync_atomic_uint32_ *)this,uVar6,uVar6 - sem_outcome & 0xfffffffd);
    } while (iVar4 == 0);
    if (sem_outcome == 0) {
      nsync_mu_unlock_slow_((nsync_mu *)this,_condition_is_true);
    }
    have_lock = 0;
    local_70 = 0;
    local_74 = 0;
    while (uVar6 = std::atomic_load_explicit<unsigned_int>
                             (&(_old_word->nw).waiting,memory_order_acquire), uVar6 != 0) {
      if ((((have_lock == 0) &&
           (abs_deadline_00.tv_nsec = abs_deadline.tv_sec,
           abs_deadline_00.tv_sec = (__time_t)cancel_note,
           have_lock = nsync_sem_wait_with_cancel_
                                 ((nsync *)_old_word,(waiter *)condition_arg_eq,abs_deadline_00,
                                  cancel_note_00), have_lock != 0)) &&
          (uVar6 = std::atomic_load_explicit<unsigned_int>
                             (&(_old_word->nw).waiting,memory_order_relaxed), uVar6 != 0)) &&
         (local_74 = mu_try_acquire_after_timeout_or_cancel
                               ((nsync_mu *)this,_condition_is_true,_old_word,uVar3), local_74 != 0)
         ) {
        has_condition = have_lock;
      }
      uVar6 = std::atomic_load_explicit<unsigned_int>(&(_old_word->nw).waiting,memory_order_relaxed)
      ;
      if (uVar6 != 0) {
        local_70 = nsync_spin_delay_(local_70);
      }
    }
    if (local_74 == 0) {
      nsync_mu_lock_slow_((nsync_mu *)this,_old_word,8,_condition_is_true);
    }
    bVar9 = true;
    if (mu != (nsync_mu *)0x0) {
      iVar4 = (*(code *)mu)(condition);
      bVar9 = iVar4 != 0;
    }
  }
  if (_old_word != (waiter *)0x0) {
    nsync_waiter_free_(_old_word);
  }
  if (bVar9) {
    has_condition = 0;
  }
  return has_condition;
}

Assistant:

int nsync_mu_wait_with_deadline (nsync_mu *mu,
				 int (*condition) (const void *condition_arg),
				 const void *condition_arg,
				 int (*condition_arg_eq) (const void *a, const void *b),
				 nsync_time abs_deadline, nsync_note cancel_note) {
	lock_type *l_type;
	int first_wait;
	int condition_is_true;
	waiter *w;
	int outcome;
	/* Work out in which mode the lock is held. */
	uint32_t old_word;
	IGNORE_RACES_START ();
	old_word = ATM_LOAD (&mu->word);
	if ((old_word & MU_ANY_LOCK) == 0) {
		nsync_panic_ ("nsync_mu not held in some mode when calling "
		       "nsync_mu_wait_with_deadline()\n");
	}
	l_type = nsync_writer_type_;
	if ((old_word & MU_RHELD_IF_NON_ZERO) != 0) {
		l_type = nsync_reader_type_;
	}

	first_wait = 1; /* first time through the loop below. */
	condition_is_true = (condition == NULL || (*condition) (condition_arg));

	/* Loop until either the condition becomes true, or "outcome" indicates
	   cancellation or timeout. */
	w = NULL;
	outcome = 0;
	while (outcome == 0 && !condition_is_true) {
		uint32_t has_condition;
		uint32_t remove_count;
		uint32_t add_to_acquire;
		int had_waiters;
		int sem_outcome;
		unsigned attempts;
		int have_lock;
		if (w == NULL) {
			w = nsync_waiter_new_ (); /* get a waiter struct if we need one. */
		}

		/* Prepare to wait. */
		w->cv_mu = NULL; /* not a condition variable wait */
		w->l_type = l_type;
		w->cond.f = condition;
		w->cond.v = condition_arg;
		w->cond.eq = condition_arg_eq;
		has_condition = 0; /* set to MU_CONDITION if condition is non-NULL */
		if (condition != NULL) {
			has_condition = MU_CONDITION;
		}
		ATM_STORE (&w->nw.waiting, 1);
		remove_count = ATM_LOAD (&w->remove_count);

		/* Acquire spinlock. */
		old_word = nsync_spin_test_and_set_ (&mu->word, MU_SPINLOCK,
			MU_SPINLOCK|MU_WAITING|has_condition, MU_ALL_FALSE);
		had_waiters = ((old_word & (MU_DESIG_WAKER | MU_WAITING)) == MU_WAITING);
		/* Queue the waiter. */
		if (first_wait) {
			nsync_maybe_merge_conditions_ (nsync_dll_last_ (mu->waiters),
						       &w->nw.q);
			/* first wait goes to end of queue */
			mu->waiters = nsync_dll_make_last_in_list_ (mu->waiters,
							            &w->nw.q);
			first_wait = 0;
		} else {
			nsync_maybe_merge_conditions_ (&w->nw.q,
						       nsync_dll_first_ (mu->waiters));
			/* subsequent waits go to front of queue */
			mu->waiters = nsync_dll_make_first_in_list_ (mu->waiters,
							             &w->nw.q);
		}
		/* Release spinlock and *mu. */
		RWLOCK_RELEASE (mu, l_type == nsync_writer_type_);
		do {
			old_word = ATM_LOAD (&mu->word);
			add_to_acquire = l_type->add_to_acquire;
			if (((old_word-l_type->add_to_acquire)&MU_ANY_LOCK) == 0 && had_waiters) {
				add_to_acquire = 0; /* release happens in nsync_mu_unlock_slow_ */
			}
		} while (!ATM_CAS_REL (&mu->word, old_word,
				       (old_word - add_to_acquire) & ~MU_SPINLOCK));
		if (add_to_acquire == 0) {
			/* The lock will be fully released, there are waiters, and
			   no designated waker, so wake waiters. */
			nsync_mu_unlock_slow_ (mu, l_type);
		}

		/* wait until awoken or a timeout. */
		sem_outcome = 0;
		attempts = 0;
		have_lock = 0;
		while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
			if (sem_outcome == 0) {
				sem_outcome = nsync_sem_wait_with_cancel_ (w, abs_deadline,
									   cancel_note);
				if (sem_outcome != 0 && ATM_LOAD (&w->nw.waiting) != 0) {
					/* A timeout or cancellation occurred, and no wakeup.
					   Acquire the spinlock and mu, and confirm. */
					have_lock = mu_try_acquire_after_timeout_or_cancel (
						mu, l_type, w, remove_count);
					if (have_lock) { /* Successful acquire. */
						outcome = sem_outcome;
					}
				}
			}

			if (ATM_LOAD (&w->nw.waiting) != 0) {
				attempts = nsync_spin_delay_ (attempts); /* will ultimately yield */
			}
		}

		if (!have_lock) {
			/* If we didn't reacquire due to a cancellation/timeout, acquire now. */
			nsync_mu_lock_slow_ (mu, w, MU_DESIG_WAKER, l_type);
			RWLOCK_TRYACQUIRE (1, mu, l_type == nsync_writer_type_);
		}
		condition_is_true = (condition == NULL || (*condition) (condition_arg));
	}
	if (w != NULL) {
		nsync_waiter_free_ (w); /* free waiter if we allocated one. */
	}
	if (condition_is_true) {
		outcome = 0; /* condition is true trumps other outcomes. */
	}
	IGNORE_RACES_END ();
	return (outcome);
}